

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::DirectFilter
          (ColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          Vector *result,TableFilter *filter,TableFilterState *filter_state,SelectionVector *sel,
          idx_t *approved_tuple_count)

{
  bool bVar1;
  idx_t iVar2;
  
  BeginRead(this,define_out,repeat_out);
  iVar2 = ReadPageHeaders(this,num_values,(optional_ptr<const_duckdb::TableFilter,_true>)filter,
                          (optional_ptr<duckdb::TableFilterState,_true>)filter_state);
  if (((iVar2 == num_values) && (this->encoding == DICTIONARY)) &&
     ((this->dictionary_decoder).filter_result.
      super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl != (bool *)0x0)) {
    if (this->page_is_filtered_out == true) {
      *approved_tuple_count = 0;
    }
    else {
      bVar1 = PrepareRead(this,num_values,define_out,repeat_out,0);
      if (bVar1) {
        define_out = (uint8_t *)0x0;
      }
      DictionaryDecoder::Filter
                (&this->dictionary_decoder,define_out,num_values,result,sel,approved_tuple_count);
    }
    this->page_rows_available = this->page_rows_available - num_values;
    FinishRead(this,num_values);
    return;
  }
  ReadInternal(this,num_values,define_out,repeat_out,result);
  ApplyFilter(result,filter,filter_state,num_values,sel,approved_tuple_count);
  return;
}

Assistant:

void ColumnReader::DirectFilter(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result,
                                const TableFilter &filter, TableFilterState &filter_state, SelectionVector &sel,
                                idx_t &approved_tuple_count) {
	auto to_read = num_values;

	// prepare the first read if we haven't yet
	BeginRead(define_out, repeat_out);
	auto read_now = ReadPageHeaders(num_values, &filter, &filter_state);

	// we can only push the filter into the decoder if we are reading the ENTIRE vector in one go
	if (encoding == ColumnEncoding::DICTIONARY && read_now == to_read && dictionary_decoder.HasFilter()) {
		if (page_is_filtered_out) {
			// the page has been filtered out entirely - skip
			approved_tuple_count = 0;
		} else {
			// Push filter into dictionary directly
			// read the defines/repeats
			const auto all_valid = PrepareRead(read_now, define_out, repeat_out, 0);
			const auto define_ptr = all_valid ? nullptr : static_cast<uint8_t *>(define_out);
			dictionary_decoder.Filter(define_ptr, read_now, result, sel, approved_tuple_count);
		}
		page_rows_available -= read_now;
		FinishRead(num_values);
		return;
	}
	// fallback to regular read + filter
	ReadInternal(num_values, define_out, repeat_out, result);
	ApplyFilter(result, filter, filter_state, num_values, sel, approved_tuple_count);
}